

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void google::protobuf::FillArenaAwareFields(TestAllTypes *message)

{
  anon_union_12_1_493b367e_for_TestAllTypes_NestedMessage_3 *paVar1;
  byte *pbVar2;
  OneofFieldUnion *this;
  long lVar3;
  TestAllTypes_NestedMessage *pTVar4;
  void *pvVar5;
  Arena *pAVar6;
  string test_string;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"hello world","");
  (message->field_0)._impl_.optional_int32_ = 0x2a;
  (message->field_0)._impl_._has_bits_.has_bits_[0] =
       (message->field_0)._impl_._has_bits_.has_bits_[0] | 0x1001;
  pAVar6 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(message->field_0)._impl_.optional_string_,&local_38,pAVar6);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 2;
  pAVar6 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(message->field_0)._impl_.optional_bytes_,&local_38,pAVar6);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 0x20;
  if ((message->field_0)._impl_.optional_nested_message_ == (TestAllTypes_NestedMessage *)0x0) {
    pAVar6 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    pTVar4 = (TestAllTypes_NestedMessage *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(pAVar6);
    (message->field_0)._impl_.optional_nested_message_ = pTVar4;
  }
  pTVar4 = (message->field_0)._impl_.optional_nested_message_;
  (pTVar4->field_0)._impl_.bb_ = 0x2a;
  paVar1 = &pTVar4->field_0;
  *(byte *)paVar1 = *(byte *)paVar1 | 1;
  if ((message->field_0)._impl_._oneof_case_[0] != 0x6f) {
    proto2_unittest::TestAllTypes::clear_oneof_field(message);
    (message->field_0)._impl_._oneof_case_[0] = 0x6f;
  }
  this = &(message->field_0)._impl_.oneof_field_;
  *(undefined4 *)((long)&message->field_0 + 800) = 0x2a;
  if ((message->field_0)._impl_._oneof_case_[0] != 0x70) {
    proto2_unittest::TestAllTypes::clear_oneof_field(message);
    (message->field_0)._impl_._oneof_case_[0] = 0x70;
    pAVar6 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    pTVar4 = (TestAllTypes_NestedMessage *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(pAVar6);
    this->oneof_nested_message_ = pTVar4;
  }
  lVar3 = *(long *)((long)&message->field_0 + 800);
  *(undefined4 *)(lVar3 + 0x18) = 0x2a;
  pbVar2 = (byte *)(lVar3 + 0x10);
  *pbVar2 = *pbVar2 | 1;
  if ((message->field_0)._impl_._oneof_case_[0] != 0x71) {
    proto2_unittest::TestAllTypes::clear_oneof_field(message);
    (message->field_0)._impl_._oneof_case_[0] = 0x71;
    (message->field_0)._impl_.oneof_field_.oneof_nested_message_ =
         (TestAllTypes_NestedMessage *)&internal::fixed_address_empty_string;
  }
  pAVar6 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&this->oneof_string_,&local_38,pAVar6);
  if ((message->field_0)._impl_._oneof_case_[0] != 0x72) {
    proto2_unittest::TestAllTypes::clear_oneof_field(message);
    (message->field_0)._impl_._oneof_case_[0] = 0x72;
    (message->field_0)._impl_.oneof_field_.oneof_nested_message_ =
         (TestAllTypes_NestedMessage *)&internal::fixed_address_empty_string;
  }
  pAVar6 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&this->oneof_string_,&local_38,pAVar6);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_int32_,0x2a);
  pvVar5 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(message->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase
                      ,Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>);
  *(undefined4 *)((long)pvVar5 + 0x18) = 0x2a;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pbVar2 = (byte *)((long)&message->field_0 + 1);
  *pbVar2 = *pbVar2 | 2;
  if ((message->field_0)._impl_.optional_lazy_message_ == (TestAllTypes_NestedMessage *)0x0) {
    pAVar6 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    pTVar4 = (TestAllTypes_NestedMessage *)
             Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(pAVar6);
    (message->field_0)._impl_.optional_lazy_message_ = pTVar4;
  }
  pTVar4 = (message->field_0)._impl_.optional_lazy_message_;
  (pTVar4->field_0)._impl_.bb_ = 0x2a;
  paVar1 = &pTVar4->field_0;
  *(byte *)paVar1 = *(byte *)paVar1 | 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FillArenaAwareFields(TestAllTypes* message) {
  std::string test_string = "hello world";
  message->set_optional_int32(42);
  message->set_optional_string(test_string);
  message->set_optional_bytes(test_string);
  message->mutable_optional_nested_message()->set_bb(42);

  message->set_oneof_uint32(42);
  message->mutable_oneof_nested_message()->set_bb(42);
  message->set_oneof_string(test_string);
  message->set_oneof_bytes(test_string);

  message->add_repeated_int32(42);
  // No repeated string: not yet arena-aware.
  message->add_repeated_nested_message()->set_bb(42);
  message->mutable_optional_lazy_message()->set_bb(42);
}